

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::~Value(Value *this)

{
  void *pvVar1;
  CommentInfo *pCVar2;
  uint uVar3;
  undefined8 *in_RDI;
  CommentInfo *this_00;
  
  uVar3 = (uint)(ushort)*(byte *)(in_RDI + 1);
  if (4 < *(byte *)(in_RDI + 1)) {
    if (uVar3 == 5) {
      if ((*(ushort *)(in_RDI + 1) >> 8 & 1) != 0) {
        releaseStringValue((char *)0x1418a2);
      }
    }
    else if (((uVar3 != 6) && (uVar3 - 7 < 2)) && (pvVar1 = (void *)*in_RDI, pvVar1 != (void *)0x0))
    {
      std::
      map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::~map((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)0x1418c5);
      operator_delete(pvVar1);
    }
  }
  if ((in_RDI[2] != 0) && (pCVar2 = (CommentInfo *)in_RDI[2], pCVar2 != (CommentInfo *)0x0)) {
    this_00 = pCVar2 + (long)pCVar2[-1].comment_;
    while (pCVar2 != this_00) {
      this_00 = this_00 + -1;
      CommentInfo::~CommentInfo(this_00);
    }
    operator_delete__(pCVar2 + -1);
  }
  return;
}

Assistant:

Value::~Value() {
  switch (type_) {
  case nullValue:
  case intValue:
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (allocated_)
      releaseStringValue(value_.string_);
    break;
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }

  if (comments_)
    delete[] comments_;
}